

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

Hop_Obj_t *
Abc_NodeCollapseFunc1
          (Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins,int *pPermFanin,int *pPermFanout)

{
  Hop_Man_t *p;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pRoot;
  ulong unaff_RBX;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  uVar3 = (ulong)(pFanout->vFanins).nSize;
  if (0 < (long)uVar3) {
    p = (Hop_Man_t *)pFanin->pNtk->pManFunc;
    uVar5 = 0;
    iVar6 = 0;
    do {
      bVar7 = (Abc_Obj_t *)pFanout->pNtk->vObjs->pArray[(pFanout->vFanins).pArray[uVar5]] == pFanin;
      uVar1 = unaff_RBX;
      if (bVar7) {
        uVar1 = uVar5;
      }
      unaff_RBX = uVar1 & 0xffffffff;
      iVar6 = iVar6 + (uint)bVar7;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
    if (iVar6 == 1) {
      iVar6 = Abc_NodeCollapseSuppSize(pFanin,pFanout,vFanins);
      Hop_IthVar(p,iVar6);
      if (p->nObjs[2] <= iVar6) {
        __assert_fail("nSize + 1 <= Hop_ManPiNum(pMan)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                      ,0x226,
                      "Hop_Obj_t *Abc_NodeCollapseFunc1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                     );
      }
      iVar2 = Abc_NodeCollapsePermMap(pFanin,(Abc_Obj_t *)0x0,vFanins,pPermFanin);
      if (iVar2 != 0) {
        iVar2 = Abc_NodeCollapsePermMap(pFanout,pFanin,vFanins,pPermFanout);
        if (iVar2 != 0) {
          pPermFanout[(int)uVar1] = iVar6;
          pHVar4 = Hop_Permute(p,(Hop_Obj_t *)(pFanin->field_5).pData,(pFanin->vFanins).nSize,
                               pPermFanin);
          pRoot = Hop_Permute(p,(Hop_Obj_t *)(pFanout->field_5).pData,(pFanout->vFanins).nSize,
                              pPermFanout);
          pHVar4 = Hop_Compose(p,pRoot,pHVar4,iVar6);
          return pHVar4;
        }
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                      ,0x22b,
                      "Hop_Obj_t *Abc_NodeCollapseFunc1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                     );
      }
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                    ,0x229,
                    "Hop_Obj_t *Abc_NodeCollapseFunc1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
  }
  return (Hop_Obj_t *)0x0;
}

Assistant:

Hop_Obj_t * Abc_NodeCollapseFunc1( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins, int * pPermFanin, int * pPermFanout )
{
    Hop_Man_t * pMan = (Hop_Man_t *)pFanin->pNtk->pManFunc;
    Hop_Obj_t * bFanin, * bFanout;
    int RetValue, nSize, iFanin;
    // can only eliminate if fanin occurs in the fanin list of the fanout exactly once
    if ( Abc_NodeCheckDupFanin( pFanin, pFanout, &iFanin ) != 1 )
        return NULL;
    // find the new number of fanins after collapsing
    nSize = Abc_NodeCollapseSuppSize( pFanin, pFanout, vFanins );
    Hop_IthVar( pMan, nSize ); // use additional var for fanin variable
    assert( nSize + 1 <= Hop_ManPiNum(pMan) );
    // find the permutation after collapsing
    RetValue = Abc_NodeCollapsePermMap( pFanin, NULL, vFanins, pPermFanin );
    assert( RetValue );
    RetValue = Abc_NodeCollapsePermMap( pFanout, pFanin, vFanins, pPermFanout );
    assert( RetValue );
    // include fanin's variable
    pPermFanout[iFanin] = nSize;
    // create new function of fanin and fanout
    bFanin  = Hop_Permute( pMan, (Hop_Obj_t *)pFanin->pData,  Abc_ObjFaninNum(pFanin),  pPermFanin );
    bFanout = Hop_Permute( pMan, (Hop_Obj_t *)pFanout->pData, Abc_ObjFaninNum(pFanout), pPermFanout );
    // compose fanin into fanout
    return Hop_Compose( pMan, bFanout, bFanin, nSize );
}